

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cones.h
# Opt level: O2

bool __thiscall
mp::
Convert1QC<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::DoRun(Convert1QC<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
        *this,LinTerms *lint,int sens,double rhs)

{
  double dVar1;
  size_ty sVar2;
  double *pdVar3;
  ptr pdVar4;
  bool bVar5;
  bool bVar6;
  byte unaff_BPL;
  bool bVar7;
  NodeRange NVar8;
  ConeArgs rhs_args;
  ConeArgs lhs_args;
  ConeArgs local_f0;
  ConeArgs local_90;
  
  sVar2 = (lint->coefs_).super_small_vector_base<std::allocator<double>,_6U>.m_data.
          super_small_vector_data_base<double_*,_unsigned_long>.m_size;
  if (rhs == 0.0 && sVar2 == 2) {
    pdVar3 = (lint->coefs_).super_small_vector_base<std::allocator<double>,_6U>.m_data.
             super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr;
    dVar1 = pdVar3[1];
    if (*pdVar3 * dVar1 < 0.0) {
      bVar7 = sens < 0 != 0.0 < dVar1;
      bVar6 = !bVar7;
      CheckNorm2(&local_f0,this,
                 (lint->vars_).super_small_vector_base<std::allocator<int>,_6U>.m_data.
                 super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr[bVar6]);
      bVar5 = true;
      unaff_BPL = bVar7;
      if (local_f0.coefs_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start !=
          local_f0.coefs_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        CheckSqrtXnXmNonneg(&local_90,this,
                            (lint->vars_).super_small_vector_base<std::allocator<int>,_6U>.m_data.
                            super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr[bVar7]);
        if (local_90.coefs_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start !=
            local_90.coefs_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          unaff_BPL = ContinueRotatedSOC(this,lint,(uint)bVar7,(uint)bVar6,&local_90,&local_f0);
        }
        ConeArgs::~ConeArgs(&local_90);
        if (local_90.coefs_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start ==
            local_90.coefs_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          bVar5 = true;
          if (local_f0.is_from_abs_ != false) goto LAB_0030a9f6;
          pdVar4 = (lint->coefs_).super_small_vector_base<std::allocator<double>,_6U>.m_data.
                   super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr;
          unaff_BPL = ContinueStdSOC(this,pdVar4[bVar7],
                                     (lint->vars_).super_small_vector_base<std::allocator<int>,_6U>.
                                     m_data.super_small_vector_data_base<int_*,_unsigned_long>.
                                     m_data_ptr[bVar7],pdVar4[bVar6],&local_f0);
        }
        bVar5 = false;
      }
LAB_0030a9f6:
      ConeArgs::~ConeArgs(&local_f0);
joined_r0x0030aa2c:
      if (!bVar5) goto LAB_0030aa07;
    }
  }
  else if (((sVar2 == 1) && ((double)sens * rhs <= 0.0)) &&
          ((double)sens *
           *(lint->coefs_).super_small_vector_base<std::allocator<double>,_6U>.m_data.
            super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr <= 0.0)) {
    CheckNorm2(&local_f0,this,
               *(lint->vars_).super_small_vector_base<std::allocator<int>,_6U>.m_data.
                super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr);
    bVar5 = true;
    if ((local_f0.coefs_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start !=
         local_f0.coefs_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish) && (local_f0.is_from_abs_ == false)) {
      NVar8 = FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
              ::MakeFixedVar(&((this->
                               super_MCKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                               ).mc_)->
                              super_FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                             ,1.0);
      unaff_BPL = ContinueStdSOC(this,ABS(rhs),NVar8.ir_.beg_,
                                 *(lint->coefs_).super_small_vector_base<std::allocator<double>,_6U>
                                  .m_data.super_small_vector_data_base<double_*,_unsigned_long>.
                                  m_data_ptr,&local_f0);
      bVar5 = false;
    }
    ConeArgs::~ConeArgs(&local_f0);
    goto joined_r0x0030aa2c;
  }
  unaff_BPL = 0;
LAB_0030aa07:
  return (bool)(unaff_BPL & 1);
}

Assistant:

bool DoRun(const LinTerms& lint,
             int sens, double rhs) {
    assert((sens==1 || sens==-1) && "sens 1 or -1 only");
    if (2 == lint.size() &&                  // x>=y
        0.0 == std::fabs(rhs) &&             // rhs=0
        0.0 > lint.coef(0)*lint.coef(1)) {   // different signs
      // For sens>0 we have x>=y and iX=(index of pos coef)
      int iX = (lint.coef(1)>0.0);
      if (sens<0)
        iX = 1-iX;
      int iY = 1-iX;
      // Check if var(iY) := || vector-or-var ||
      if (auto rhs_args = CheckNorm2(lint.var(iY))) {
        if (auto lhs_args = CheckSqrtXnXmNonneg(lint.var(iX)))
          return ContinueRotatedSOC(lint, iX, iY,
                                    lhs_args, rhs_args);
        if (!rhs_args.is_from_abs_)          // not x >= abs(...)
          return ContinueStdSOC(lint.coef(iX), lint.var(iX),
                                lint.coef(iY), rhs_args);
      }
    } else if (1 == lint.size() &&           // const>=y.
               0.0 >= rhs*sens &&            // either ... <= rhs
               // or ... >= rhs(<0)
               0.0 >= lint.coef(0)*sens) {   // In the other case,
      // it's -k*sqrt(...) <= rhs(>0), k>0,
      // which is always true TODO
      if (auto rhs_args = CheckNorm2(lint.var(0))) {
        if (!rhs_args.is_from_abs_)          // not const >= abs(...)
          return ContinueStdSOC(std::fabs(rhs),
                                int( MC().MakeFixedVar( 1.0 ) ),
                                lint.coef(0), rhs_args);
      }
    }
    return false;
  }